

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.hpp
# Opt level: O0

void tl::printError<char_const*>(char **args)

{
  char (*in_RCX) [2];
  char **args_local;
  
  fprint<char_const*,char[2]>(_stderr,(FILE *)args,(char **)0x39b467,in_RCX);
  return;
}

Assistant:

static void printError(const Args&... args)
{
    fprint(stderr, args..., "\n");
}